

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::Validator::validate
          (Validator *this,Reader *type,Reader *value,uint *dataSizeInBits,bool *isPointer)

{
  bool bVar1;
  Which WVar2;
  Which WVar3;
  uint local_80;
  uint local_7c;
  Fault local_78;
  Fault f;
  undefined1 local_68 [8];
  DebugComparison<capnp::schema::Value::Which,_capnp::schema::Value::Which_&> _kjCondition;
  bool hadCase;
  Which expectedValueType;
  bool *isPointer_local;
  uint *dataSizeInBits_local;
  Reader *value_local;
  Reader *type_local;
  Validator *this_local;
  
  validate(this,type);
  _kjCondition._38_2_ = 0;
  _kjCondition._37_1_ = 0;
  WVar2 = capnp::schema::Type::Reader::which(type);
  switch(WVar2) {
  case VOID:
    _kjCondition._38_2_ = 0;
    *dataSizeInBits = 0;
    *isPointer = false;
    _kjCondition._37_1_ = 1;
    break;
  case BOOL:
    _kjCondition._38_2_ = 1;
    *dataSizeInBits = 1;
    *isPointer = false;
    _kjCondition._37_1_ = 1;
    break;
  case INT8:
    _kjCondition._38_2_ = 2;
    *dataSizeInBits = 8;
    *isPointer = false;
    _kjCondition._37_1_ = 1;
    break;
  case INT16:
    _kjCondition._38_2_ = 3;
    *dataSizeInBits = 0x10;
    *isPointer = false;
    _kjCondition._37_1_ = 1;
    break;
  case INT32:
    _kjCondition._38_2_ = 4;
    *dataSizeInBits = 0x20;
    *isPointer = false;
    _kjCondition._37_1_ = 1;
    break;
  case INT64:
    _kjCondition._38_2_ = 5;
    *dataSizeInBits = 0x40;
    *isPointer = false;
    _kjCondition._37_1_ = 1;
    break;
  case UINT8:
    _kjCondition._38_2_ = 6;
    *dataSizeInBits = 8;
    *isPointer = false;
    _kjCondition._37_1_ = 1;
    break;
  case UINT16:
    _kjCondition._38_2_ = 7;
    *dataSizeInBits = 0x10;
    *isPointer = false;
    _kjCondition._37_1_ = 1;
    break;
  case UINT32:
    _kjCondition._38_2_ = 8;
    *dataSizeInBits = 0x20;
    *isPointer = false;
    _kjCondition._37_1_ = 1;
    break;
  case UINT64:
    _kjCondition._38_2_ = 9;
    *dataSizeInBits = 0x40;
    *isPointer = false;
    _kjCondition._37_1_ = 1;
    break;
  case FLOAT32:
    _kjCondition._38_2_ = 10;
    *dataSizeInBits = 0x20;
    *isPointer = false;
    _kjCondition._37_1_ = 1;
    break;
  case FLOAT64:
    _kjCondition._38_2_ = 0xb;
    *dataSizeInBits = 0x40;
    *isPointer = false;
    _kjCondition._37_1_ = 1;
    break;
  case TEXT:
    _kjCondition._38_2_ = 0xc;
    *dataSizeInBits = 0;
    *isPointer = true;
    _kjCondition._37_1_ = 1;
    break;
  case DATA:
    _kjCondition._38_2_ = 0xd;
    *dataSizeInBits = 0;
    *isPointer = true;
    _kjCondition._37_1_ = 1;
    break;
  case LIST:
    _kjCondition._38_2_ = 0xe;
    *dataSizeInBits = 0;
    *isPointer = true;
    _kjCondition._37_1_ = 1;
    break;
  case ENUM:
    _kjCondition._38_2_ = 0xf;
    *dataSizeInBits = 0x10;
    *isPointer = false;
    _kjCondition._37_1_ = 1;
    break;
  case STRUCT:
    _kjCondition._38_2_ = 0x10;
    *dataSizeInBits = 0;
    *isPointer = true;
    _kjCondition._37_1_ = 1;
    break;
  case INTERFACE:
    _kjCondition._38_2_ = 0x11;
    *dataSizeInBits = 0;
    *isPointer = true;
    _kjCondition._37_1_ = 1;
    break;
  case ANY_POINTER:
    _kjCondition._38_2_ = 0x12;
    *dataSizeInBits = 0;
    *isPointer = true;
    _kjCondition._37_1_ = 1;
  }
  if ((_kjCondition._37_1_ & 1) != 0) {
    f.exception._4_2_ = capnp::schema::Value::Reader::which(value);
    f.exception._6_2_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Which *)((long)&f.exception + 4));
    kj::_::DebugExpression<capnp::schema::Value::Which>::operator==
              ((DebugComparison<capnp::schema::Value::Which,_capnp::schema::Value::Which_&> *)
               local_68,(DebugExpression<capnp::schema::Value::Which> *)((long)&f.exception + 6),
               (Which *)&_kjCondition.field_0x26);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_68);
    if (!bVar1) {
      WVar3 = capnp::schema::Value::Reader::which(value);
      local_7c = (uint)WVar3;
      local_80 = (uint)(ushort)_kjCondition._38_2_;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::schema::Value::Which,capnp::schema::Value::Which&>&,char_const(&)[26],unsigned_int,unsigned_int>
                (&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,500,FAILED,"value.which() == expectedValueType",
                 "_kjCondition,\"Value did not match type.\", (uint)value.which(), (uint)expectedValueType"
                 ,(DebugComparison<capnp::schema::Value::Which,_capnp::schema::Value::Which_&> *)
                  local_68,(char (*) [26])"Value did not match type.",&local_7c,&local_80);
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&local_78);
    }
  }
  return;
}

Assistant:

void validate(const schema::Type::Reader& type, const schema::Value::Reader& value,
                uint* dataSizeInBits, bool* isPointer) {
    validate(type);

    schema::Value::Which expectedValueType = schema::Value::VOID;
    bool hadCase = false;
    switch (type.which()) {
#define HANDLE_TYPE(name, bits, ptr) \
      case schema::Type::name: \
        expectedValueType = schema::Value::name; \
        *dataSizeInBits = bits; *isPointer = ptr; \
        hadCase = true; \
        break;
      HANDLE_TYPE(VOID, 0, false)
      HANDLE_TYPE(BOOL, 1, false)
      HANDLE_TYPE(INT8, 8, false)
      HANDLE_TYPE(INT16, 16, false)
      HANDLE_TYPE(INT32, 32, false)
      HANDLE_TYPE(INT64, 64, false)
      HANDLE_TYPE(UINT8, 8, false)
      HANDLE_TYPE(UINT16, 16, false)
      HANDLE_TYPE(UINT32, 32, false)
      HANDLE_TYPE(UINT64, 64, false)
      HANDLE_TYPE(FLOAT32, 32, false)
      HANDLE_TYPE(FLOAT64, 64, false)
      HANDLE_TYPE(TEXT, 0, true)
      HANDLE_TYPE(DATA, 0, true)
      HANDLE_TYPE(LIST, 0, true)
      HANDLE_TYPE(ENUM, 16, false)
      HANDLE_TYPE(STRUCT, 0, true)
      HANDLE_TYPE(INTERFACE, 0, true)
      HANDLE_TYPE(ANY_POINTER, 0, true)
#undef HANDLE_TYPE
    }

    if (hadCase) {
      VALIDATE_SCHEMA(value.which() == expectedValueType, "Value did not match type.",
                      (uint)value.which(), (uint)expectedValueType);
    }
  }